

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkItemGraphVisitor.cxx
# Opt level: O2

bool __thiscall cmLinkItemGraphVisitor::ItemVisited(cmLinkItemGraphVisitor *this,cmLinkItem *item)

{
  string *psVar1;
  iterator iVar2;
  _Rb_tree_header *p_Var3;
  
  psVar1 = cmLinkItem::AsStr_abi_cxx11_(item);
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::find(&(this->VisitedItems)._M_t,psVar1);
  p_Var3 = &(this->VisitedItems)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar2._M_node == p_Var3) {
    psVar1 = cmLinkItem::AsStr_abi_cxx11_(item);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->VisitedItems,psVar1);
  }
  return (_Rb_tree_header *)iVar2._M_node != p_Var3;
}

Assistant:

bool cmLinkItemGraphVisitor::ItemVisited(cmLinkItem const& item)
{
  auto& collection = this->VisitedItems;

  bool const visited = collection.find(item.AsStr()) != collection.cend();

  if (!visited) {
    collection.insert(item.AsStr());
  }

  return visited;
}